

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O0

int lws_finalize_http_header(lws *wsi,uchar **p,uchar *end)

{
  uchar *puVar1;
  int iVar2;
  uchar *end_local;
  uchar **p_local;
  lws *wsi_local;
  
  iVar2 = lws_wsi_is_h2(wsi);
  if (iVar2 == 0) {
    if ((long)end - (long)*p < 3) {
      wsi_local._4_4_ = 1;
    }
    else {
      puVar1 = *p;
      *p = puVar1 + 1;
      *puVar1 = '\r';
      puVar1 = *p;
      *p = puVar1 + 1;
      *puVar1 = '\n';
      wsi_local._4_4_ = 0;
    }
  }
  else {
    wsi_local._4_4_ = 0;
  }
  return wsi_local._4_4_;
}

Assistant:

int lws_finalize_http_header(struct lws *wsi, unsigned char **p,
			     unsigned char *end)
{
#ifdef LWS_WITH_HTTP2
	if (lws_wsi_is_h2(wsi))
		return 0;
#else
	(void)wsi;
#endif
	if ((lws_intptr_t)(end - *p) < 3)
		return 1;
	*((*p)++) = '\x0d';
	*((*p)++) = '\x0a';

	return 0;
}